

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall NaStateSpaceModel::Function(NaStateSpaceModel *this,NaReal *pU,NaReal *pY)

{
  uint uVar1;
  long in_RDX;
  EVP_PKEY_CTX *src;
  NaVector *in_RDI;
  uint i;
  NaVector y1;
  NaVector x2;
  NaVector x1;
  NaVector y;
  NaVector u;
  uint in_stack_ffffffffffffff3c;
  NaVector *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff4c;
  uint local_a4;
  NaVector *in_stack_ffffffffffffff70;
  NaVector *in_stack_ffffffffffffff78;
  NaMatrix *in_stack_ffffffffffffff80;
  EVP_PKEY_CTX local_70 [40];
  NaVector local_48 [2];
  long local_18;
  
  local_18 = in_RDX;
  NaVector::NaVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  NaVector::NaVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  NaVector::operator=(in_RDI,(NaReal *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                     );
  NaVector::NaVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  NaVector::NaVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  NaVector::NaVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  NaMatrix::multiply(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  NaMatrix::multiply(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  NaVector::add(in_RDI,(NaVector *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  NaMatrix::multiply(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  NaMatrix::multiply(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  NaVector::copy((NaVector *)&in_RDI[7].bOwnStorage,local_70,src);
  NaVector::add(in_RDI,(NaVector *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (local_18 != 0) {
    local_a4 = 0;
    while (uVar2 = local_a4, uVar1 = NaVector::dim(local_48), uVar2 < uVar1) {
      in_stack_ffffffffffffff40 =
           (NaVector *)NaVector::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      *(_func_int ***)(local_18 + (ulong)local_a4 * 8) = in_stack_ffffffffffffff40->_vptr_NaVector;
      local_a4 = local_a4 + 1;
    }
  }
  NaVector::~NaVector(in_stack_ffffffffffffff40);
  NaVector::~NaVector(in_stack_ffffffffffffff40);
  NaVector::~NaVector(in_stack_ffffffffffffff40);
  NaVector::~NaVector(in_stack_ffffffffffffff40);
  NaVector::~NaVector(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void
NaStateSpaceModel::Function (NaReal* pU, NaReal* pY)
{
    NaVector	u(k), y(m);
    u = pU;

    NaVector    x1(n), x2(n), y1(m);

    // y(t) = C*x(t) + D*u(t)
    C.multiply(x, y);            // y = C * x
    D.multiply(u, y1);           // y1 = D * u
    y.add(y1);                   // y += y1

    // x(t+1) = A*x(t) + B*u(t)
    A.multiply(x, x1);           // x1 = A * x
    B.multiply(u, x2);           // x2 = B * u
    x.copy(x1);                  // x = x1
    x.add(x2);                   // x += x2

    if(pY != NULL) {
	for(unsigned i = 0; i < y.dim(); ++i)
	    pY[i] = y[i];
    }
}